

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_hardlink.c
# Opt level: O0

void test_write_disk_hardlink(void)

{
  wchar_t wVar1;
  int iVar2;
  archive_entry *paVar3;
  archive_entry *paVar4;
  archive_entry *paVar5;
  void *in_stack_00000010;
  int r;
  archive_entry *ae;
  archive *ad;
  undefined4 in_stack_00000070;
  wchar_t in_stack_00000074;
  char *in_stack_00000078;
  wchar_t in_stack_00000084;
  char *in_stack_00000088;
  archive_entry *in_stack_ffffffffffffffd8;
  char *path1;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  wchar_t wVar6;
  
  assertion_umask((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                  (wchar_t)in_stack_ffffffffffffffd8);
  paVar3 = (archive_entry *)archive_write_disk_new();
  assertion_assert(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  paVar4 = archive_entry_new();
  assertion_assert((char *)paVar4,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)in_stack_ffffffffffffffd8);
  archive_entry_set_mode(paVar4,0x81ed);
  archive_entry_set_size(paVar4,0x1b);
  wVar1 = (wchar_t)((ulong)paVar4 >> 0x20);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar1,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar3,(char *)0x1ce1fd,in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3
                     ,0x1ce213);
  assertion_equal_int((char *)paVar4,wVar1,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1ce244,in_stack_00000010);
  archive_write_finish_entry((archive *)0x1ce24e);
  paVar3 = paVar4;
  assertion_equal_int((char *)paVar4,wVar1,
                      CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar4,(char *)0x1ce27d,in_stack_00000010);
  archive_entry_free((archive_entry *)0x1ce287);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar4);
  archive_entry_set_mode(paVar5,0x81a2);
  archive_entry_set_size(paVar5,0);
  wVar6 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_entry_copy_hardlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar4);
  wVar1 = archive_write_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4
                    );
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar3,(char *)0x1ce33b,in_stack_00000010);
  if (L'\xffffffeb' < wVar1) {
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar3,0x1ce35c);
    assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1ce38f,in_stack_00000010);
    paVar3 = paVar4;
    archive_write_finish_entry((archive *)0x1ce399);
    paVar4 = paVar3;
    assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x1ce3c8,in_stack_00000010);
  }
  archive_entry_free((archive_entry *)0x1ce3d2);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,wVar1,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,0x1b);
  wVar6 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  paVar3 = paVar4;
  assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar4,(char *)0x1ce472,in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4
                     ,0x1ce488);
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1ce4b9,in_stack_00000010);
  archive_write_finish_entry((archive *)0x1ce4c3);
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar3,(char *)0x1ce4f2,in_stack_00000010);
  archive_entry_free((archive_entry *)0x1ce4fc);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,wVar1,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_set_mode(paVar5,0x81a2);
  wVar6 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_entry_unset_size((archive_entry *)0x1ce559);
  archive_entry_copy_hardlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  wVar1 = archive_write_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3
                    );
  paVar3 = paVar4;
  assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar4,(char *)0x1ce5ac,in_stack_00000010);
  if (L'\xffffffeb' < wVar1) {
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar4,0x1ce5cd);
    assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1ce600,in_stack_00000010);
    paVar4 = paVar3;
    archive_write_finish_entry((archive *)0x1ce60a);
    paVar3 = paVar4;
    assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar4,(char *)0x1ce639,in_stack_00000010);
  }
  archive_entry_free((archive_entry *)0x1ce643);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,wVar1,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar4);
  archive_entry_set_mode(paVar5,0x8180);
  archive_entry_set_size(paVar5,0x1b);
  wVar6 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4);
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar3,(char *)0x1ce6e3,in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3
                     ,0x1ce6f9);
  assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1ce72a,in_stack_00000010);
  archive_write_finish_entry((archive *)0x1ce734);
  paVar3 = paVar4;
  assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar4,(char *)0x1ce763,in_stack_00000010);
  archive_entry_free((archive_entry *)0x1ce76d);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,wVar1,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar4);
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,0x1b);
  wVar6 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_entry_copy_hardlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar4);
  wVar1 = archive_write_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4
                    );
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar3,(char *)0x1ce822,in_stack_00000010);
  if (L'\xffffffec' < wVar1) {
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar3,0x1ce843);
    assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1ce874,in_stack_00000010);
    paVar3 = paVar4;
    archive_write_finish_entry((archive *)0x1ce87e);
    paVar4 = paVar3;
    assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x1ce8ad,in_stack_00000010);
  }
  archive_entry_free((archive_entry *)0x1ce8b7);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,wVar1,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_set_mode(paVar5,0x8180);
  archive_entry_set_size(paVar5,0);
  wVar6 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  paVar3 = paVar4;
  assertion_equal_int((char *)paVar4,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar4,(char *)0x1ce956,in_stack_00000010);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar4
                     ,0x1ce96c);
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1ce99f,in_stack_00000010);
  archive_write_finish_entry((archive *)0x1ce9a9);
  paVar4 = paVar3;
  assertion_equal_int((char *)paVar3,wVar6,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar3,(char *)0x1ce9d8,in_stack_00000010);
  archive_entry_free((archive_entry *)0x1ce9e2);
  paVar5 = archive_entry_new();
  assertion_assert((char *)paVar5,wVar1,in_stack_ffffffffffffffe8,
                   (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  archive_entry_set_mode(paVar5,0x81ed);
  archive_entry_set_size(paVar5,0x1b);
  wVar1 = (wchar_t)((ulong)paVar5 >> 0x20);
  archive_entry_copy_hardlink
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (char *)paVar3);
  iVar2 = archive_write_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3
                    );
  paVar3 = paVar4;
  assertion_equal_int((char *)paVar4,wVar1,CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (longlong)paVar4,(char *)0x1cea97,in_stack_00000010);
  if (-0x19 < iVar2) {
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar4,0x1ceab8);
    assertion_equal_int((char *)paVar3,wVar1,CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1ceae9,in_stack_00000010);
    archive_write_finish_entry((archive *)0x1ceaf3);
    assertion_equal_int((char *)paVar3,wVar1,CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x1ceb22,in_stack_00000010);
  }
  archive_entry_free((archive_entry *)0x1ceb2c);
  archive_write_free((archive *)0x1ceb36);
  path1 = (char *)0x0;
  assertion_equal_int((char *)paVar3,wVar1,CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x1ceb64,in_stack_00000010);
  assertion_is_reg(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_file_size(in_stack_00000088,in_stack_00000084,in_stack_00000078,
                      CONCAT44(in_stack_00000074,in_stack_00000070));
  assertion_file_nlinks(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_is_hardlink
            ((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,path1,
             (char *)0x1cebda);
  assertion_is_reg(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_file_size(in_stack_00000088,in_stack_00000084,in_stack_00000078,
                      CONCAT44(in_stack_00000074,in_stack_00000070));
  assertion_file_nlinks(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_is_hardlink
            ((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,path1,
             (char *)0x1cec50);
  assertion_is_reg(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_file_size(in_stack_00000088,in_stack_00000084,in_stack_00000078,
                      CONCAT44(in_stack_00000074,in_stack_00000070));
  assertion_file_nlinks(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_is_hardlink
            ((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,path1,
             (char *)0x1cecc6);
  assertion_is_reg(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_file_nlinks(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
  assertion_file_size(in_stack_00000088,in_stack_00000084,in_stack_00000078,
                      CONCAT44(in_stack_00000074,in_stack_00000070));
  assertion_is_hardlink
            ((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,path1,
             (char *)0x1ced3c);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_hardlink)
{
#if defined(__HAIKU__)
	skipping("archive_write_disk_hardlink; hardlinks are not supported on bfs");
#else
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct archive *ad;
	struct archive_entry *ae;
	int r;

	/* Force the umask to something predictable. */
	assertUmask(UMASK);

	/* Write entries to disk. */
	assert((ad = archive_write_disk_new()) != NULL);

	/*
	 * First, use a tar-like approach; a regular file, then
	 * a separate "hardlink" entry.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1a");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link.  Size of zero means this doesn't carry data. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1b");
	archive_entry_set_mode(ae, S_IFREG | 0642);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_hardlink(ae, "link1a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Repeat tar approach test, but use unset to mark the
	 * hardlink as having no data.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2a");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link.  Unset size means this doesn't carry data. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2b");
	archive_entry_set_mode(ae, S_IFREG | 0642);
	archive_entry_unset_size(ae);
	archive_entry_copy_hardlink(ae, "link2a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Second, try an old-cpio-like approach; a regular file, then
	 * another identical one (which has been marked hardlink).
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link3a");
	archive_entry_set_mode(ae, S_IFREG | 0600);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data), archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link3b");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	archive_entry_copy_hardlink(ae, "link3a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r > ARCHIVE_WARN) {
		assertEqualInt(sizeof(data),
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Finally, try a new-cpio-like approach, where the initial
	 * regular file is empty and the hardlink has the data.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link4a");
	archive_entry_set_mode(ae, S_IFREG | 0600);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(ARCHIVE_WARN, archive_write_data(ad, data, 1));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link4b");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	archive_entry_copy_hardlink(ae, "link4a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r > ARCHIVE_FAILED) {
		assertEqualInt(sizeof(data),
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entries on disk. */

	/* Test #1 */
	/* If the hardlink was successfully created and the archive
	 * doesn't carry data for it, we consider it to be
	 * non-authoritative for meta data as well.  This is consistent
	 * with GNU tar and BSD pax.  */
	assertIsReg("link1a", 0755 & ~UMASK);
	assertFileSize("link1a", sizeof(data));
	assertFileNLinks("link1a", 2);
	assertIsHardlink("link1a", "link1b");

	/* Test #2: Should produce identical results to test #1 */
	/* Note that marking a hardlink with size = 0 is treated the
	 * same as having an unset size.  This is partly for backwards
	 * compatibility (we used to not have unset tracking, so
	 * relied on size == 0) and partly to match the model used by
	 * common file formats that store a size of zero for
	 * hardlinks. */
	assertIsReg("link2a", 0755 & ~UMASK);
	assertFileSize("link2a", sizeof(data));
	assertFileNLinks("link2a", 2);
	assertIsHardlink("link2a", "link2b");

	/* Test #3 */
	assertIsReg("link3a", 0755 & ~UMASK);
	assertFileSize("link3a", sizeof(data));
	assertFileNLinks("link3a", 2);
	assertIsHardlink("link3a", "link3b");

	/* Test #4 */
	assertIsReg("link4a", 0755 & ~UMASK);
	assertFileNLinks("link4a", 2);
	assertFileSize("link4a", sizeof(data));
	assertIsHardlink("link4a", "link4b");
#endif
}